

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatconfig.c
# Opt level: O3

int ecx_reconfig_slave(ecx_contextt *context,uint16 slave,int timeout)

{
  uint16 ADP;
  _func_int_uint16 *p_Var1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  undefined6 in_register_00000032;
  ec_slavet *peVar6;
  long lVar7;
  ulong uVar8;
  uint16 uVar9;
  long lVar10;
  
  uVar5 = CONCAT62(in_register_00000032,slave) & 0xffffffff;
  ADP = context->slavelist[uVar5].configadr;
  iVar3 = ecx_FPWRw(context->port,ADP,0x120,1,timeout);
  if (iVar3 < 1) {
    uVar4 = 0;
  }
  else {
    ecx_eeprom2pdi(context,slave);
    uVar2 = ecx_statecheck(context,slave,1,2000000);
    if (uVar2 == 1) {
      lVar7 = uVar5 * 0x148 + 0x39;
      uVar9 = 0x800;
      lVar10 = 8;
      do {
        if (*(short *)((long)context->slavelist->SM + lVar7 + -0x39) != 0) {
          ecx_FPWR(context->port,ADP,uVar9,8,(void *)((long)context->slavelist->SM + lVar7 + -0x39),
                   timeout);
        }
        uVar9 = uVar9 + 8;
        lVar7 = lVar7 + 8;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
      ecx_FPWRw(context->port,ADP,0x120,2,timeout);
      uVar2 = ecx_statecheck(context,slave,2,2000000);
      if (uVar2 == 2) {
        p_Var1 = context->slavelist[uVar5].PO2SOconfig;
        if (p_Var1 != (_func_int_uint16 *)0x0) {
          (*p_Var1)(slave);
        }
        ecx_FPWRw(context->port,ADP,0x120,4,timeout);
        uVar2 = ecx_statecheck(context,slave,4,2000000);
        peVar6 = context->slavelist;
        if (peVar6[uVar5].FMMUunused != '\0') {
          lVar7 = uVar5 * 0x148 + 0x81;
          uVar9 = 0x600;
          uVar8 = 0;
          do {
            ecx_FPWR(context->port,ADP,uVar9,0x10,(void *)((long)peVar6->SM + lVar7 + -0x39),timeout
                    );
            uVar8 = uVar8 + 1;
            peVar6 = context->slavelist;
            uVar9 = uVar9 + 0x10;
            lVar7 = lVar7 + 0x10;
          } while (uVar8 < peVar6[uVar5].FMMUunused);
        }
      }
    }
    uVar4 = (uint)uVar2;
  }
  return uVar4;
}

Assistant:

int ecx_reconfig_slave(ecx_contextt *context, uint16 slave, int timeout)
{
   int state, nSM, FMMUc;
   uint16 configadr;
   
   configadr = context->slavelist[slave].configadr;
   if (ecx_FPWRw(context->port, configadr, ECT_REG_ALCTL, htoes(EC_STATE_INIT) , timeout) <= 0)
   {
      return 0;
   }
   state = 0;
   ecx_eeprom2pdi(context, slave); /* set Eeprom control to PDI */         
   /* check state change init */
   state = ecx_statecheck(context, slave, EC_STATE_INIT, EC_TIMEOUTSTATE);
   if(state == EC_STATE_INIT)
   {
      /* program all enabled SM */
      for( nSM = 0 ; nSM < EC_MAXSM ; nSM++ )
      {   
         if (context->slavelist[slave].SM[nSM].StartAddr)
         {   
            ecx_FPWR(context->port, configadr, ECT_REG_SM0 + (nSM * sizeof(ec_smt)),
               sizeof(ec_smt), &context->slavelist[slave].SM[nSM], timeout);
         }
      }
      ecx_FPWRw(context->port, configadr, ECT_REG_ALCTL, htoes(EC_STATE_PRE_OP) , timeout);
      state = ecx_statecheck(context, slave, EC_STATE_PRE_OP, EC_TIMEOUTSTATE); /* check state change pre-op */
      if( state == EC_STATE_PRE_OP)
      {
         /* execute special slave configuration hook Pre-Op to Safe-OP */
         if(context->slavelist[slave].PO2SOconfig) /* only if registered */
         {       
            context->slavelist[slave].PO2SOconfig(slave);         
         }
         ecx_FPWRw(context->port, configadr, ECT_REG_ALCTL, htoes(EC_STATE_SAFE_OP) , timeout); /* set safeop status */
         state = ecx_statecheck(context, slave, EC_STATE_SAFE_OP, EC_TIMEOUTSTATE); /* check state change safe-op */
         /* program configured FMMU */
         for( FMMUc = 0 ; FMMUc < context->slavelist[slave].FMMUunused ; FMMUc++ )
         {   
            ecx_FPWR(context->port, configadr, ECT_REG_FMMU0 + (sizeof(ec_fmmut) * FMMUc),
               sizeof(ec_fmmut), &context->slavelist[slave].FMMU[FMMUc], timeout);
         }
      }
   }

   return state;      
}